

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Backward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  double dVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  complex<double> *pcVar16;
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  long lVar20;
  undefined8 uVar21;
  long local_88;
  complex<double> local_58;
  double local_48;
  double dStack_40;
  
  lVar12 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar8 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar12 != CONCAT44(extraout_var,iVar8)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
  }
  iVar8 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar12 = CONCAT44(extraout_var_00,iVar8);
  if (lVar12 != 0) {
    if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
      lVar18 = 1;
      if (lVar12 < 1) {
        lVar18 = lVar12;
      }
      lVar9 = lVar12 * 0x10 + -8;
      lVar20 = 0;
      lVar13 = 0;
      lVar11 = lVar9;
      lVar14 = lVar12;
LAB_00cc743c:
      do {
        lVar17 = lVar18;
        lVar15 = lVar18 + -1;
        if (1 < lVar14) {
          if (((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow < lVar14) ||
             ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar13)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar10 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * lVar20;
          dVar1 = *(double *)(B->fElem->_M_value + lVar11 + -8 + lVar10);
          lVar15 = lVar14 + -1;
          lVar17 = lVar14;
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            dVar1 = *(double *)(B->fElem->_M_value + lVar11 + lVar10);
            if ((dVar1 == 0.0) && (lVar11 = lVar11 + -0x10, lVar14 = lVar15, !NAN(dVar1)))
            goto LAB_00cc743c;
          }
        }
        if (1 < lVar17) {
          lVar11 = lVar15 * 0x10;
          do {
            local_88 = lVar11 + -0x10;
            local_58._M_value._0_8_ = 0;
            local_58._M_value._8_8_ = 0;
            ppcVar2 = (this->fElem).fStore;
            pcVar16 = ppcVar2[lVar15];
            pcVar3 = ppcVar2[lVar15 + 1];
            if (((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
               ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar13)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar14 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
            pcVar4 = B->fElem;
            lVar17 = lVar14 * lVar13;
            uVar21 = *(undefined8 *)(pcVar4[lVar17 + lVar15]._M_value + 8);
            uVar6 = __divdc3((int)*(undefined8 *)pcVar4[lVar17 + lVar15]._M_value,uVar21,
                             *(undefined8 *)pcVar16->_M_value,*(undefined8 *)(pcVar16->_M_value + 8)
                            );
            *(undefined8 *)pcVar4[lVar17 + lVar15]._M_value = uVar6;
            *(undefined8 *)(pcVar4[lVar17 + lVar15]._M_value + 8) = uVar21;
            local_58._M_value._0_8_ = *(undefined8 *)pcVar4[lVar17 + lVar15]._M_value;
            local_58._M_value._8_8_ = *(undefined8 *)(pcVar4[lVar17 + lVar15]._M_value + 8);
            pcVar16 = pcVar16 + 1;
            if (pcVar16 < pcVar3) {
              pauVar19 = (undefined1 (*) [16])(pcVar4[-1]._M_value + lVar14 * lVar20 + lVar11);
              do {
                local_48 = *(double *)pcVar16->_M_value;
                dStack_40 = *(double *)(pcVar16->_M_value + 8);
                std::complex<double>::operator*=((complex<double> *)&local_48,&local_58);
                dVar1 = *(double *)(*pauVar19 + 8) - dStack_40;
                auVar7._8_4_ = SUB84(dVar1,0);
                auVar7._0_8_ = *(double *)*pauVar19 - local_48;
                auVar7._12_4_ = (int)((ulong)dVar1 >> 0x20);
                *pauVar19 = auVar7;
                pcVar16 = pcVar16 + 1;
                pauVar19 = pauVar19 + -1;
              } while (pcVar16 < pcVar3);
            }
            bVar5 = 1 < lVar15;
            lVar15 = lVar15 + -1;
            lVar11 = local_88;
          } while (bVar5);
        }
        lVar13 = lVar13 + 1;
        lVar20 = lVar20 + 0x10;
        lVar11 = lVar9;
        lVar14 = lVar12;
      } while (lVar13 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
    }
    if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
      lVar12 = 0;
      do {
        pcVar16 = *(this->fElem).fStore;
        if ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow < 1) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar3 = B->fElem;
        lVar18 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * lVar12;
        uVar21 = *(undefined8 *)(pcVar3[lVar18]._M_value + 8);
        uVar6 = __divdc3((int)*(undefined8 *)pcVar3[lVar18]._M_value,uVar21,
                         *(undefined8 *)pcVar16->_M_value,*(undefined8 *)(pcVar16->_M_value + 8));
        *(undefined8 *)pcVar3[lVar18]._M_value = uVar6;
        *(undefined8 *)(pcVar3[lVar18]._M_value + 8) = uVar21;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}